

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KalmanFilter.cpp
# Opt level: O2

void __thiscall
iDynTree::DiscreteKalmanFilterHelper::DiscreteKalmanFilterHelper(DiscreteKalmanFilterHelper *this)

{
  iDynTree::VectorDynSize::VectorDynSize(&this->m_x);
  iDynTree::VectorDynSize::VectorDynSize(&this->m_x0);
  iDynTree::VectorDynSize::VectorDynSize(&this->m_u);
  iDynTree::VectorDynSize::VectorDynSize(&this->m_y);
  iDynTree::MatrixDynSize::MatrixDynSize(&this->m_A);
  iDynTree::MatrixDynSize::MatrixDynSize(&this->m_B);
  iDynTree::MatrixDynSize::MatrixDynSize(&this->m_C);
  iDynTree::MatrixDynSize::MatrixDynSize(&this->m_D);
  iDynTree::MatrixDynSize::MatrixDynSize(&this->m_P);
  iDynTree::MatrixDynSize::MatrixDynSize(&this->m_P0);
  iDynTree::MatrixDynSize::MatrixDynSize(&this->m_Q);
  iDynTree::MatrixDynSize::MatrixDynSize(&this->m_R);
  this->m_use_feed_through = false;
  this->m_use_control_input = false;
  this->m_is_initialized = false;
  this->m_filter_constructed = false;
  this->m_initial_state_set = false;
  this->m_initial_state_covariance_set = false;
  this->m_measurement_noise_covariance_matrix_set = false;
  this->m_system_noise_covariance_matrix_set = false;
  this->m_measurement_updated = false;
  this->m_input_updated = false;
  return;
}

Assistant:

iDynTree::DiscreteKalmanFilterHelper::DiscreteKalmanFilterHelper()
{

}